

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_XScream(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  AActor *ent;
  bool bVar1;
  bool local_43;
  FSoundID local_40;
  FSoundID local_3c;
  AActor *local_38;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc75,
                  "int AF_AActor_A_XScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    local_38 = (AActor *)(param->field_0).field_1.a;
    local_43 = true;
    if (local_38 != (AActor *)0x0) {
      local_43 = DObject::IsKindOf((DObject *)local_38,AActor::RegistrationInfo.MyClass);
    }
    ent = local_38;
    if (local_43 != false) {
      if (local_38->player == (player_t *)0x0) {
        FSoundID::FSoundID(&local_40,"misc/gibbed");
        S_Sound(ent,2,&local_40,1.0,1.0);
      }
      else {
        FSoundID::FSoundID(&local_3c,"*gibbed");
        S_Sound(ent,2,&local_3c,1.0,1.0);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc75,
                  "int AF_AActor_A_XScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc75,"int AF_AActor_A_XScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_XScream)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (self->player)
		S_Sound (self, CHAN_VOICE, "*gibbed", 1, ATTN_NORM);
	else
		S_Sound (self, CHAN_VOICE, "misc/gibbed", 1, ATTN_NORM);
	return 0;
}